

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O0

void glcts::GeometryShaderLayeredFBOShared::initTOs
               (Functions *gl,glTexStorage3DMultisampleFunc pGLTexStorage3DMultisample,
               GLuint *out_to_ids)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLenum GVar7;
  GLuint to_id_f;
  GLuint to_id_e;
  GLuint to_id_d;
  GLuint to_id_c;
  GLuint to_id_b;
  GLuint to_id_a_prim;
  GLuint to_id_a;
  GLuint *out_to_ids_local;
  glTexStorage3DMultisampleFunc pGLTexStorage3DMultisample_local;
  Functions *gl_local;
  
  (*gl->genTextures)(7,out_to_ids);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glGenTextures() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xcd);
  GVar1 = out_to_ids[1];
  GVar2 = out_to_ids[2];
  GVar3 = out_to_ids[3];
  GVar4 = out_to_ids[4];
  GVar5 = out_to_ids[5];
  GVar6 = out_to_ids[6];
  (*gl->bindTexture)(0xde1,*out_to_ids);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xd9);
  (*gl->texStorage2D)(0xde1,1,0x8058,4,4);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xde);
  (*gl->bindTexture)(0xde1,GVar1);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xe2);
  (*gl->texStorage2D)(0xde1,1,0x81a5,4,4);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xe7);
  (*gl->bindTexture)(0x8c1a,GVar2);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xeb);
  (*gl->texStorage3D)(0x8c1a,1,0x8058,4,4,4);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage3D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xf0);
  (*gl->bindTexture)(0x806f,GVar3);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xf4);
  (*gl->texStorage3D)(0x806f,1,0x8058,4,4,4);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage3D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xf9);
  (*gl->bindTexture)(0x8513,GVar4);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0xfd);
  (*gl->texStorage2D)(0x8513,1,0x8058,4,4);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x102);
  (*gl->bindTexture)(0x9100,GVar5);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x106);
  (*gl->texStorage2DMultisample)(0x9100,2,0x8058,4,4,'\x01');
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage2DMultisample() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x10b);
  (*gl->bindTexture)(0x9102,GVar6);
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x10f);
  (*pGLTexStorage3DMultisample)(0x9102,2,0x8058,4,4,4,'\x01');
  GVar7 = (*gl->getError)();
  glu::checkError(GVar7,"glTexStorage3DMultisample() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFBO.cpp"
                  ,0x114);
  return;
}

Assistant:

void GeometryShaderLayeredFBOShared::initTOs(const glw::Functions&				gl,
											 glw::glTexStorage3DMultisampleFunc pGLTexStorage3DMultisample,
											 glw::GLuint*						out_to_ids)
{
	gl.genTextures(n_shared_to_ids, out_to_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	/* Set up texture object A */
	const glw::GLuint to_id_a	  = out_to_ids[0];
	const glw::GLuint to_id_a_prim = out_to_ids[1];
	const glw::GLuint to_id_b	  = out_to_ids[2];
	const glw::GLuint to_id_c	  = out_to_ids[3];
	const glw::GLuint to_id_d	  = out_to_ids[4];
	const glw::GLuint to_id_e	  = out_to_ids[5];
	const glw::GLuint to_id_f	  = out_to_ids[6];

	gl.bindTexture(GL_TEXTURE_2D, to_id_a);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
					GL_RGBA8,		  /* color-renderable internalformat */
					shared_to_width, shared_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Set up texture object A' */
	gl.bindTexture(GL_TEXTURE_2D, to_id_a_prim);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1,	 /* levels */
					GL_DEPTH_COMPONENT16, /* depth-renderable internalformat */
					shared_to_width, shared_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Set up texture object B */
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, to_id_b);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, /* levels */
					GL_RGBA8,				/* color-renderable internalformat */
					shared_to_width, shared_to_height, shared_to_depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");

	/* Set up texture object C */
	gl.bindTexture(GL_TEXTURE_3D, to_id_c);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage3D(GL_TEXTURE_3D, 1, /* levels */
					GL_RGBA8,		  /* color-renderable internalformats */
					shared_to_width, shared_to_height, shared_to_depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");

	/* Set up texture object D */
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, to_id_d);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1, /* levels */
					GL_RGBA8,				/* color-renderable internalformat */
					shared_to_width, shared_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Set up texture object E */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id_e);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2,				/* samples */
							   GL_RGBA8,									/* color-renderable internalformat */
							   shared_to_width, shared_to_height, GL_TRUE); /* fixedsamplelocations */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed.");

	/* Set up texture object F */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, to_id_f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	pGLTexStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 2, /* samples */
							   GL_RGBA8,						   /* color-renderable internalformat */
							   shared_to_width, shared_to_height, shared_to_depth, GL_TRUE); /* fixedsamplelocations */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3DMultisample() call failed.");
}